

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * Lowerer::LoadFloatFromNonReg(Opnd *opndSrc,Opnd *opndDst,Instr *instrInsert)

{
  Var aValue;
  code *pcVar1;
  bool bVar2;
  AddrOpnd *pAVar3;
  IntConstOpnd *pIVar4;
  ulong uVar5;
  FloatConstOpnd *pFVar6;
  Float32ConstOpnd *pFVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  float floatValue;
  Var var;
  double value;
  Instr *instrInsert_local;
  Opnd *opndDst_local;
  Opnd *opndSrc_local;
  
  bVar2 = IR::Opnd::IsAddrOpnd(opndSrc);
  if (bVar2) {
    pAVar3 = IR::Opnd::AsAddrOpnd(opndSrc);
    aValue = pAVar3->m_address;
    bVar2 = Js::TaggedInt::Is(aValue);
    if (bVar2) {
      var = (Var)Js::TaggedInt::ToDouble(aValue);
    }
    else {
      var = (Var)Js::JavascriptNumber::GetValue(aValue);
    }
  }
  else {
    bVar2 = IR::Opnd::IsIntConstOpnd(opndSrc);
    if (bVar2) {
      bVar2 = IR::Opnd::IsUInt32(opndSrc);
      if (bVar2) {
        pIVar4 = IR::Opnd::AsIntConstOpnd(opndSrc);
        uVar5 = IR::EncodableOpnd<long>::GetValue(&pIVar4->super_EncodableOpnd<long>);
        uVar5 = uVar5 & 0xffffffff;
      }
      else {
        pIVar4 = IR::Opnd::AsIntConstOpnd(opndSrc);
        uVar5 = IR::EncodableOpnd<long>::GetValue(&pIVar4->super_EncodableOpnd<long>);
      }
      var = (Var)(double)(long)uVar5;
    }
    else {
      bVar2 = IR::Opnd::IsFloatConstOpnd(opndSrc);
      if (bVar2) {
        pFVar6 = IR::Opnd::AsFloatConstOpnd(opndSrc);
        var = (Var)pFVar6->m_value;
      }
      else {
        bVar2 = IR::Opnd::IsFloat32ConstOpnd(opndSrc);
        if (bVar2) {
          pFVar7 = IR::Opnd::AsFloat32ConstOpnd(opndSrc);
          pIVar9 = LowererMD::LoadFloatValue<float>(opndDst,pFVar7->m_value,instrInsert);
          return pIVar9;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x398f,"(0)","Unexpected opnd type");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar8 = 0;
        var = (Var)0x0;
      }
    }
  }
  pIVar9 = LowererMD::LoadFloatValue<double>(opndDst,(double)var,instrInsert);
  return pIVar9;
}

Assistant:

IR::Instr *
Lowerer::LoadFloatFromNonReg(IR::Opnd * opndSrc, IR::Opnd * opndDst, IR::Instr * instrInsert)
{
    double value;

    if (opndSrc->IsAddrOpnd())
    {
        Js::Var var = opndSrc->AsAddrOpnd()->m_address;
        if (Js::TaggedInt::Is(var))
        {
            value = Js::TaggedInt::ToDouble(var);
        }
        else
        {
            value = Js::JavascriptNumber::GetValue(var);
        }
    }
    else if (opndSrc->IsIntConstOpnd())
    {
        if (opndSrc->IsUInt32())
        {
            value = (double)(uint32)opndSrc->AsIntConstOpnd()->GetValue();
        }
        else
        {
            value = (double)opndSrc->AsIntConstOpnd()->GetValue();
        }
    }
    else if (opndSrc->IsFloatConstOpnd())
    {
        value = (double)opndSrc->AsFloatConstOpnd()->m_value;
    }
    else if (opndSrc->IsFloat32ConstOpnd())
    {
        float floatValue = opndSrc->AsFloat32ConstOpnd()->m_value;
        return LowererMD::LoadFloatValue(opndDst, floatValue, instrInsert);
    }
    else
    {
        AssertMsg(0, "Unexpected opnd type");
        value = 0;
    }

    return LowererMD::LoadFloatValue(opndDst, value, instrInsert);
}